

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O1

Am_Wrapper * __thiscall Am_Double_Data::Make_Unique(Am_Double_Data *this)

{
  uint uVar1;
  Am_Double_Data *this_00;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  this_00 = this;
  if (uVar1 != 1) {
    uVar1 = uVar1 - 1;
    (this->super_Am_Wrapper).refs = uVar1;
    if (uVar1 == 0) {
      (*(this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this);
    }
    this_00 = (Am_Double_Data *)operator_new(0x18);
    Am_Double_Data(this_00,this->value);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

bool
Am_Double_Data::operator==(const Am_Double_Data &test_value) const
{
  return (this == &test_value) || ((double)test_value == value);
}